

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O3

void __thiscall IR::Print::visit(Print *this,Exp *e)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  args;
  undefined8 local_18;
  undefined8 uStack_10;
  long lVar3;
  
  iVar2 = (*((e->super_tuple<const_IR::Expr_*>).super__Tuple_impl<0UL,_const_IR::Expr_*>.
             super__Head_base<0UL,_const_IR::Expr_*,_false>._M_head_impl)->_vptr_Expr[5])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    local_18 = *(undefined8 *)(lVar3 + 0x10);
    uStack_10 = *(undefined8 *)(lVar3 + 0x18);
    format_str.size_ = 5;
    format_str.data_ = "\t{0};";
    args.field_1.values_ =
         (value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
          *)&local_18;
    args.desc_ = 0xd;
    fmt::v7::vprint<char>(this->out,format_str,args);
    cVar1 = (char)this->out;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    return;
  }
  __assert_fail("!\"unreachable\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/pgen/ir-print.cc"
                ,0x3d,"virtual void IR::Print::visit(IR::Exp *)");
}

Assistant:

void Print::visit(IR::Exp* e) {
  if (auto code = e->expr()->asCode()) {
    fmt::print(out, "\t{0};", code->text());
    out << std::endl;
  } else {
    assert(!"unreachable");
  }
}